

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

bool is_name(char *str,char *namelist)

{
  bool bVar1;
  bool bVar2;
  char *argument;
  char *argument_00;
  char part [4608];
  char name [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  if (namelist != (char *)0x0) {
    if (str == (char *)0x0) {
      return false;
    }
    if (*namelist == '\0') {
      return false;
    }
    if (*str != '\0') {
      argument = one_argument(str,local_2438);
      if (local_2438[0] != '\0') {
        argument_00 = namelist;
        do {
          argument_00 = one_argument(argument_00,local_1238);
          bVar2 = local_1238[0] != '\0';
          if (local_1238[0] == '\0') {
            return bVar2;
          }
          bVar1 = str_cmp(str,local_1238);
          if (!bVar1) {
            return bVar2;
          }
          bVar2 = str_cmp(local_2438,local_1238);
        } while ((bVar2) ||
                (argument = one_argument(argument,local_2438), argument_00 = namelist,
                local_2438[0] != '\0'));
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool is_name(const char *str, const char *namelist)
{
	char name[MAX_INPUT_LENGTH], part[MAX_INPUT_LENGTH];
	char *list, *string;

	/* fix crash on nullptr namelist */
	if (namelist == nullptr || namelist[0] == '\0')
		return false;

	/* fixed to prevent is_name on "" returning true */
	if (str == nullptr || str[0] == '\0')
		return false;

	string = (char *)str;
	/* we need ALL parts of string to match part of namelist */
	for (;;) /* start parsing string */
	{
		str = one_argument((char *)str, part);

		if (part[0] == '\0')
			return true;

		/* check to see if this is part of namelist */
		list = (char *)namelist;
		for (;;) /* start parsing namelist */
		{
			list = one_argument(list, name);

			if (name[0] == '\0') /* this name was not found */
				return false;

			if (!str_cmp(string, name))
				return true; /* full pattern match */

			if (!str_cmp(part, name))
				break;
		}
	}
}